

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall
wasm::WasmBinaryWriter::writeInlineBuffer(WasmBinaryWriter *this,char *data,size_t size)

{
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)(uint)size);
  writeData(this,data,size);
  return;
}

Assistant:

void WasmBinaryWriter::writeInlineBuffer(const char* data, size_t size) {
  o << U32LEB(size);
  writeData(data, size);
}